

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

void __thiscall String::~String(String *this)

{
  (this->super_Value).super_Member._vptr_Member = (_func_int **)&PTR__String_00134368;
  std::__cxx11::string::~string((string *)&this->value);
  return;
}

Assistant:

String() = default;